

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.hpp
# Opt level: O3

void __thiscall
rek::sample::AliasSampler::AliasSampler
          (AliasSampler *this,vector<double,_std::allocator<double>_> *probs)

{
  pointer pdVar1;
  pointer pdVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  allocator_type local_2b;
  allocator_type local_2a;
  allocator_type local_29;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->A,((long)(probs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(probs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start >> 3) + 2,&local_29);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->B,((long)(probs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(probs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start >> 3) + 2,&local_2a);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->Y,((long)(probs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(probs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start >> 3) + 2,&local_2b);
  pdVar1 = (probs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (ulong)((long)(probs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar1) >> 3;
  this->N = (uint)uVar3;
  uVar3 = uVar3 & 0xffffffff;
  if (uVar3 != 0) {
    dVar5 = 0.0;
    uVar4 = 0;
    do {
      dVar5 = dVar5 + pdVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
    pdVar2 = (this->Y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      pdVar2[uVar4 + 1] = pdVar1[uVar4] * (1.0 / dVar5);
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return;
}

Assistant:

explicit AliasSampler(const std::vector<double> &probs)
      : A(probs.size() + 2), B(probs.size() + 2), Y(probs.size() + 2) {
    double sum = 0;

    this->N = (unsigned int)probs.size();
    for (size_t j = 0; j < N; j++) {
      sum += probs[j];
    }

    sum = 1 / sum;

    // Normalize it now
    for (size_t j = 0; j < N; j++) Y[j + 1] = probs[j] * sum;
  }